

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::TestForSeparator(XFileParser *this)

{
  XFileParser *this_local;
  
  if ((((this->mIsBinaryFormat & 1U) == 0) && (FindNextNoneWhiteSpace(this), this->mP < this->mEnd))
     && ((*this->mP == ';' || (*this->mP == ',')))) {
    this->mP = this->mP + 1;
  }
  return;
}

Assistant:

void XFileParser::TestForSeparator()
{
  if( mIsBinaryFormat)
    return;

  FindNextNoneWhiteSpace();
  if( mP >= mEnd)
    return;

  // test and skip
  if( *mP == ';' || *mP == ',')
    mP++;
}